

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint64_t helper_cksm(CPUS390XState_conflict *env,uint64_t r1,uint64_t src,uint64_t src_len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uintptr_t unaff_retaddr;
  
  uVar5 = r1 & 0xffffffff;
  uVar6 = 0x2000;
  if (src_len < 0x2000) {
    uVar6 = src_len;
  }
  if (src_len < 4) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar1 = cpu_ldl_data_ra_s390x(env,uVar3 + src,unaff_retaddr);
      uVar5 = uVar5 + uVar1;
      uVar4 = uVar3 + 4;
      uVar8 = uVar3 + 8;
      uVar3 = uVar4;
    } while (uVar8 <= uVar6);
    src = src + uVar4;
  }
  lVar7 = uVar6 - uVar4;
  if (lVar7 == 3) {
    uVar1 = cpu_lduw_data_ra_s390x(env,src,unaff_retaddr);
    uVar2 = cpu_ldub_data_ra_s390x(env,src + 2,unaff_retaddr);
    uVar5 = uVar5 + (uVar1 << 0x10) + (ulong)(uVar2 << 8);
    uVar4 = uVar4 | 3;
  }
  else if (lVar7 == 2) {
    uVar1 = cpu_lduw_data_ra_s390x(env,src,unaff_retaddr);
    uVar5 = uVar5 + (uVar1 << 0x10);
    uVar4 = uVar4 | 2;
  }
  else if (lVar7 == 1) {
    uVar1 = cpu_ldub_data_ra_s390x(env,src,unaff_retaddr);
    uVar5 = uVar5 + (uVar1 << 0x18);
    uVar4 = uVar4 | 1;
  }
  for (; uVar5 >> 0x20 != 0; uVar5 = (uVar5 >> 0x20) + (uVar5 & 0xffffffff)) {
  }
  env->cc_op = (uint)(uVar4 != src_len) * 3;
  env->retxl = uVar5;
  return uVar4;
}

Assistant:

uint64_t HELPER(cksm)(CPUS390XState *env, uint64_t r1,
                      uint64_t src, uint64_t src_len)
{
    uintptr_t ra = GETPC();
    uint64_t max_len, len;
    uint64_t cksm = (uint32_t)r1;

    /* Lest we fail to service interrupts in a timely manner, limit the
       amount of work we're willing to do.  For now, let's cap at 8k.  */
    max_len = (src_len > 0x2000 ? 0x2000 : src_len);

    /* Process full words as available.  */
    for (len = 0; len + 4 <= max_len; len += 4, src += 4) {
        cksm += (uint32_t)cpu_ldl_data_ra(env, src, ra);
    }

    switch (max_len - len) {
    case 1:
        cksm += cpu_ldub_data_ra(env, src, ra) << 24;
        len += 1;
        break;
    case 2:
        cksm += cpu_lduw_data_ra(env, src, ra) << 16;
        len += 2;
        break;
    case 3:
        cksm += cpu_lduw_data_ra(env, src, ra) << 16;
        cksm += cpu_ldub_data_ra(env, src + 2, ra) << 8;
        len += 3;
        break;
    }

    /* Fold the carry from the checksum.  Note that we can see carry-out
       during folding more than once (but probably not more than twice).  */
    while (cksm > 0xffffffffull) {
        cksm = (uint32_t)cksm + (cksm >> 32);
    }

    /* Indicate whether or not we've processed everything.  */
    env->cc_op = (len == src_len ? 0 : 3);

    /* Return both cksm and processed length.  */
    env->retxl = cksm;
    return len;
}